

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

string * __thiscall
re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  char *pcVar1;
  uint *puVar2;
  bool bVar3;
  uint *puVar4;
  string local_60;
  uint *local_30;
  iterator it;
  char *sep;
  DFA *local_18;
  Workq *q_local;
  string *s;
  
  sep._7_1_ = 0;
  local_18 = this;
  q_local = (Workq *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  it = (iterator)0x39491f;
  for (local_30 = (uint *)SparseSetT<void>::begin((SparseSetT<void> *)local_18); puVar2 = local_30,
      puVar4 = (uint *)SparseSetT<void>::end((SparseSetT<void> *)local_18), puVar2 != puVar4;
      local_30 = local_30 + 1) {
    bVar3 = Workq::is_mark((Workq *)local_18,*local_30);
    if (bVar3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"|");
      pcVar1 = "\t";
    }
    else {
      StringPrintf_abi_cxx11_(&local_60,"%s%d",it,(ulong)*local_30);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      pcVar1 = "},";
    }
    it = (iterator)(pcVar1 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}